

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
(anonymous_namespace)::get_env<char_const*>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,_anonymous_namespace_ *this,string *_env_name,char *_default)

{
  char *pcVar1;
  ostream *poVar2;
  allocator<char> local_349;
  stringstream local_348 [8];
  stringstream _ss_1;
  ostream local_338 [392];
  stringstream local_1b0 [8];
  stringstream _ss;
  ostream local_1a0 [376];
  char *local_28;
  char *_env_val;
  char *_default_local;
  string *_env_name_local;
  
  _env_val = (char *)_env_name;
  _default_local = (char *)this;
  _env_name_local = __return_storage_ptr__;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_28 = getenv(pcVar1);
  pcVar1 = _env_val;
  if (local_28 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,&local_349);
    std::allocator<char>::~allocator(&local_349);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a0,std::skipws);
    std::operator<<(poVar2,local_28);
    std::__cxx11::stringstream::stringstream(local_348);
    std::operator<<(local_338,local_28);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_348);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

auto get_env(const std::string &_env_name, Tp _default) {
  const char *_env_val = std::getenv(_env_name.c_str());

  if (_env_val) {
    std::stringstream _ss{};
    _ss << std::skipws << _env_val;
    if constexpr (std::is_same<std::decay_t<Tp>, const char *>::value) {
      std::stringstream _ss{};
      _ss << _env_val;
      return _ss.str();
    } else {
      Tp _val{};
      std::istringstream{_env_val} >> _val;
      return _val;
    }
  }

  if constexpr (std::is_same<std::decay_t<Tp>, const char *>::value) {
    return std::string{_default};
  } else {
    return _default;
  }
}